

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O3

void shade_round(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  int iVar1;
  int iVar2;
  Fl_Color FVar3;
  uchar *puVar4;
  size_t sVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong local_d0;
  ulong local_c8;
  char *local_b0;
  char *local_90;
  
  local_d0 = (ulong)(uint)h;
  local_c8 = (ulong)(uint)w;
  uVar12 = (ulong)(uint)y;
  uVar9 = (ulong)(uint)x;
  puVar4 = fl_gray_ramp();
  sVar5 = strlen(c);
  uVar6 = (int)sVar5 - 1;
  uVar8 = ((int)sVar5 - ((int)uVar6 >> 0x1f)) + -1 >> 1;
  if (h < w) {
    iVar13 = h / 2;
    if (1 < (int)uVar6) {
      iVar1 = w + x;
      iVar10 = iVar1 - iVar13;
      local_90 = c + uVar6;
      iVar2 = h + -1;
      uVar6 = 0x195;
      uVar12 = 0;
      do {
        iVar7 = (int)uVar12;
        uVar15 = x + iVar7;
        uVar14 = y + iVar7;
        FVar3 = fl_color_average((uint)puVar4[c[uVar12]],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0x4056800000000000,fl_graphics_driver,(ulong)uVar15,(ulong)uVar14,local_d0,
                   local_d0);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,iVar13 + x,(ulong)uVar14,iVar10);
        uVar11 = (iVar1 - h) + iVar7;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar6 - 0x168),0x4056800000000000,fl_graphics_driver,(ulong)uVar11,
                   (ulong)uVar14,local_d0,local_d0);
        FVar3 = fl_color_average((uint)puVar4[(long)c[uVar12] + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar6 - 0x5a),(double)uVar6,fl_graphics_driver,(ulong)uVar11,
                   (ulong)uVar14,local_d0,local_d0);
        FVar3 = fl_color_average((uint)puVar4[*local_90],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0x4070e00000000000,(double)(uVar6 - 0x5a),fl_graphics_driver,(ulong)uVar11,
                   (ulong)uVar14,local_d0,local_d0);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,iVar13 + x,(ulong)(uint)(iVar2 + y),iVar10);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar6 - 0xb4),0x4070e00000000000,fl_graphics_driver,(ulong)uVar15,
                   (ulong)uVar14,local_d0,local_d0);
        FVar3 = fl_color_average((uint)puVar4[(long)*local_90 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar6 - 0x10e),(double)(uVar6 - 0xb4),fl_graphics_driver,(ulong)uVar15,
                   (ulong)uVar14,local_d0,local_d0);
        uVar12 = uVar12 + 1;
        w = (int)local_c8 - 2;
        local_c8 = (ulong)(uint)w;
        local_d0 = (ulong)((int)local_d0 - 2);
        uVar6 = uVar6 + 8;
        local_90 = local_90 + -1;
        iVar2 = iVar2 + -1;
      } while (uVar8 != uVar12);
      iVar13 = iVar13 - uVar8;
      uVar9 = (ulong)(uint)(x + (int)uVar12);
      uVar12 = (ulong)(uint)(y + (int)uVar12);
    }
    FVar3 = fl_color_average((uint)puVar4[c[(int)uVar8]],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar3);
    iVar2 = (int)local_d0;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(uint)(iVar13 + (int)uVar9),uVar12,(ulong)((w - iVar2) + 1)
               ,(ulong)(iVar2 + 1));
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              (0x4056800000000000,0x4070e00000000000,fl_graphics_driver,uVar9,uVar12,local_d0,
               local_d0);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21];
    uVar9 = (ulong)(uint)(((int)uVar9 + w) - iVar2);
    uVar16 = 0x4070e00000000000;
    uVar17 = 0x4056800000000000;
  }
  else {
    iVar13 = w / 2;
    if (1 < (int)uVar6) {
      iVar2 = h + y;
      iVar10 = iVar2 - iVar13;
      local_b0 = c + uVar6;
      iVar1 = w + -1;
      uVar6 = 0x13b;
      uVar12 = 0;
      do {
        iVar7 = (int)uVar12;
        uVar11 = x + iVar7;
        uVar14 = y + iVar7;
        FVar3 = fl_color_average((uint)puVar4[c[uVar12]],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (fl_graphics_driver,(ulong)uVar11,(ulong)uVar14,local_c8,local_c8);
        FVar3 = fl_color_average((uint)puVar4[(long)c[uVar12] + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0,(double)(uVar6 - 0x10e),fl_graphics_driver,(ulong)uVar11,(ulong)uVar14,local_c8
                   ,local_c8);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)(uint)(x + iVar1),iVar13 + y,iVar10);
        uVar15 = (iVar2 - w) + iVar7;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)uVar6,0x4076800000000000,fl_graphics_driver,(ulong)uVar11,(ulong)uVar15,
                   local_c8,local_c8);
        FVar3 = fl_color_average((uint)puVar4[*local_b0],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar6 - 0x5a),(double)uVar6,fl_graphics_driver,(ulong)uVar11,
                   (ulong)uVar15,local_c8,local_c8);
        FVar3 = fl_color_average((uint)puVar4[(long)*local_b0 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0x4066800000000000,(double)(uVar6 - 0x5a),fl_graphics_driver,(ulong)uVar11,
                   (ulong)uVar15,local_c8,local_c8);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)uVar11,iVar13 + y,iVar10);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar6 - 0xb4),0x4066800000000000,fl_graphics_driver,(ulong)uVar11,uVar14
                   ,local_c8,local_c8);
        uVar12 = uVar12 + 1;
        local_c8 = (ulong)((int)local_c8 - 2);
        h = (int)local_d0 - 2;
        local_d0 = (ulong)(uint)h;
        uVar6 = uVar6 + 8;
        local_b0 = local_b0 + -1;
        iVar1 = iVar1 + -1;
      } while (uVar8 != uVar12);
      iVar13 = iVar13 - uVar8;
      uVar9 = (ulong)(uint)(x + (int)uVar12);
      uVar12 = (ulong)(uint)(y + (int)uVar12);
    }
    FVar3 = fl_color_average((uint)puVar4[c[(int)uVar8]],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar3);
    iVar2 = (int)local_c8;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,uVar9,(ulong)(uint)(iVar13 + (int)uVar12),(ulong)(iVar2 + 1),
               (ulong)((h - iVar2) + 1));
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              (0,0x4066800000000000,fl_graphics_driver,uVar9,uVar12,local_c8,local_c8);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21];
    uVar17 = 0x4076800000000000;
    uVar12 = (ulong)(uint)(((int)uVar12 + h) - iVar2);
    uVar16 = 0x4066800000000000;
    local_d0 = local_c8;
  }
  (*UNRECOVERED_JUMPTABLE)(uVar16,uVar17,fl_graphics_driver,uVar9,uVar12,local_d0,local_d0);
  return;
}

Assistant:

static void shade_round(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  int	i;
  int 	clen = (int) (strlen(c) - 1);
  int 	chalf = clen / 2;

  if (w>h) {
    int d = h/2;
    const int na = 8;
    for (i=0; i<chalf; i++, d--, x++, y++, w-=2, h-=2)
    {
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_pie(x, y, h, h, 90.0, 135.0+i*na);
      fl_xyline(x+d, y, x+w-d);
      fl_pie(x+w-h, y, h, h, 45.0+i*na, 90.0);
      fl_color(shade_color(g[(int)c[i] - 2], bc));
      fl_pie(x+w-h, y, h, h, 315.0+i*na, 405.0+i*na);
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_pie(x+w-h, y, h, h, 270.0, 315.0+i*na);
      fl_xyline(x+d, y+h-1, x+w-d);
      fl_pie(x, y, h, h, 225.0+i*na, 270.0);
      fl_color(shade_color(g[c[(int)clen - i] - 2], bc));
      fl_pie(x, y, h, h, 135.0+i*na, 225.0+i*na);
    }
    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x+d, y, w-h+1, h+1);
    fl_pie(x, y, h, h, 90.0, 270.0);
    fl_pie(x+w-h, y, h, h, 270.0, 90.0);
  } else {
    int d = w/2;
    const int na = 8;
    for (i=0; i<chalf; i++, d--, x++, y++, w-=2, h-=2)
    {
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_pie(x, y, w, w, 45.0+i*na, 135.0+i*na);
      fl_color(shade_color(g[c[i] - 2], bc));
      fl_pie(x, y, w, w, 0.0, 45.0+i*na);
      fl_yxline(x+w-1, y+d, y+h-d);
      fl_pie(x, y+h-w, w, w, 315.0+i*na, 360.0);
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_pie(x, y+h-w, w, w, 225.0+i*na, 315.0+i*na);
      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_pie(x, y+h-w, w, w, 180.0, 225.0+i*na);
      fl_yxline(x, y+d, y+h-d);
      fl_pie(x, y, w, w, 135.0+i*na, 180.0);
    }
    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x, y+d, w+1, h-w+1);
    fl_pie(x, y, w, w, 0.0, 180.0);
    fl_pie(x, y+h-w, w, w, 180.0, 360.0);
  }
}